

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioSourceVoice_SetFrequencyRatio
                   (FAudioSourceVoice *voice,float Ratio,uint32_t OperationSet)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  int in_ESI;
  long *in_RDI;
  float in_XMM0_Da;
  SDL_AssertState sdl_assert_state;
  uint32_t in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if ((in_ESI == 0) || (*(char *)(*in_RDI + 1) == '\0')) {
    do {
      if (*(int *)((long)in_RDI + 0xc) == 0) goto LAB_0012955e;
      iVar2 = SDL_ReportAssertion(&FAudioSourceVoice_SetFrequencyRatio::sdl_assert_data,
                                  "FAudioSourceVoice_SetFrequencyRatio",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                  ,0xaec);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_0012955e:
    if ((*(uint *)(in_RDI + 1) & 2) == 0) {
      if (in_XMM0_Da < *(float *)((long)in_RDI + 0xf4) ||
          in_XMM0_Da == *(float *)((long)in_RDI + 0xf4)) {
        if (in_XMM0_Da < 0.0009765625) {
          in_XMM0_Da = 0.0009765625;
        }
      }
      else {
        in_XMM0_Da = *(float *)((long)in_RDI + 0xf4);
      }
      *(float *)((long)in_RDI + 0x11c) = in_XMM0_Da;
    }
  }
  else {
    FAudio_OPERATIONSET_QueueSetFrequencyRatio
              ((FAudioSourceVoice *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_SetFrequencyRatio(
	FAudioSourceVoice *voice,
	float Ratio,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetFrequencyRatio(
			voice,
			Ratio,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}
	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);

	if (voice->flags & FAUDIO_VOICE_NOPITCH)
	{
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	voice->src.freqRatio = FAudio_clamp(
		Ratio,
		FAUDIO_MIN_FREQ_RATIO,
		voice->src.maxFreqRatio
	);
	LOG_API_EXIT(voice->audio)
	return 0;
}